

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncoding xmlParseCharEncoding(char *name)

{
  xmlCharEncoding xVar1;
  void *pvVar2;
  xmlCharEncoding xVar3;
  
  if (name == (char *)0x0) {
    xVar3 = XML_CHAR_ENCODING_NONE;
  }
  else {
    pvVar2 = bsearch(name,xmlEncTable,0x25,0x10,xmlCompareEncTableEntries);
    if (pvVar2 == (void *)0x0) {
      xVar3 = XML_CHAR_ENCODING_ERROR;
    }
    else {
      xVar3 = *(xmlCharEncoding *)((long)pvVar2 + 8);
    }
  }
  xVar1 = XML_CHAR_ENCODING_UTF16LE;
  if (xVar3 != XML_CHAR_ENCODING_UTF16) {
    xVar1 = xVar3;
  }
  return xVar1;
}

Assistant:

static xmlCharEncoding
xmlParseCharEncodingInternal(const char *name)
{
    const xmlEncTableEntry *entry;

    if (name == NULL)
       return(XML_CHAR_ENCODING_NONE);

    entry = bsearch(name, xmlEncTable,
                    sizeof(xmlEncTable) / sizeof(xmlEncTable[0]),
                    sizeof(xmlEncTable[0]), xmlCompareEncTableEntries);
    if (entry != NULL)
        return(entry->enc);

    return(XML_CHAR_ENCODING_ERROR);
}